

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O3

UCollationResult __thiscall
icu_63::RuleBasedCollator::doCompare
          (RuleBasedCollator *this,UChar *left,int32_t leftLength,UChar *right,int32_t rightLength,
          UErrorCode *errorCode)

{
  Normalizer2Impl *nfcImpl;
  long lVar1;
  UBool UVar2;
  UChar UVar3;
  UCollationResult UVar4;
  ulong uVar5;
  CollationSettings *settings;
  int32_t leftLength_00;
  int rightLength_00;
  UChar *pUVar6;
  uint uVar7;
  uint uVar8;
  UTF16CollationIterator rightIter;
  UTF16CollationIterator leftIter;
  byte local_489;
  UChar *local_478;
  UChar *local_470;
  CollationSettings **local_468;
  ulong local_458;
  undefined1 local_450 [48];
  UnicodeString local_420 [5];
  int32_t local_2e0;
  SkippedState *local_2d8;
  int32_t local_2d0;
  byte local_2cc;
  UChar *local_2c8;
  UChar *local_2c0;
  UChar *local_2b8;
  UChar *local_2b0;
  UChar *local_2a8;
  UChar *local_2a0;
  UChar *local_298;
  Normalizer2Impl *local_290;
  undefined **local_288;
  StackBufferOrFields local_280;
  int8_t local_248;
  undefined1 local_240 [48];
  UnicodeString local_210 [5];
  int32_t local_d0;
  SkippedState *local_c8;
  int32_t local_c0;
  byte local_bc;
  UChar *local_b8;
  UChar *local_b0;
  UChar *local_a8;
  UChar *local_a0;
  UChar *local_98;
  UChar *local_90;
  UChar *local_88;
  Normalizer2Impl *local_80;
  undefined **local_78;
  StackBufferOrFields local_70;
  int8_t local_38;
  
  if (left == right && leftLength == rightLength) {
    return UCOL_EQUAL;
  }
  if (leftLength < 0) {
    UVar3 = *left;
    if (UVar3 != *right) {
      local_489 = (byte)this->settings->options >> 1 & 1;
      local_478 = (UChar *)0x0;
      local_470 = (UChar *)0x0;
      goto LAB_0021fa32;
    }
    uVar5 = 0;
    do {
      if (UVar3 == L'\0') {
        return UCOL_EQUAL;
      }
      local_458 = uVar5 + 1;
      UVar3 = left[uVar5 + 1];
      lVar1 = uVar5 + 1;
      uVar5 = local_458;
    } while (UVar3 == right[lVar1]);
    local_489 = (byte)this->settings->options >> 1 & 1;
    local_478 = (UChar *)0x0;
    local_470 = (UChar *)0x0;
LAB_0021f9f0:
    uVar7 = (uint)local_458;
    if (((uVar7 != leftLength) &&
        (UVar2 = CollationData::isUnsafeBackward
                           (this->data,(uint)(ushort)left[local_458 & 0xffffffff],local_489),
        UVar2 != '\0')) ||
       ((uVar8 = rightLength, uVar7 != rightLength &&
        (UVar2 = CollationData::isUnsafeBackward
                           (this->data,(uint)(ushort)right[local_458 & 0xffffffff],local_489),
        uVar8 = uVar7, UVar2 != '\0')))) {
      local_458 = local_458 & 0xffffffff;
      pUVar6 = left + (uVar7 - 1);
      do {
        if ((int)local_458 < 2) {
          uVar8 = 0;
          break;
        }
        UVar2 = CollationData::isUnsafeBackward(this->data,(uint)(ushort)*pUVar6,local_489);
        uVar8 = (int)local_458 - 1;
        local_458 = (ulong)uVar8;
        pUVar6 = pUVar6 + -1;
      } while (UVar2 != '\0');
    }
  }
  else {
    if (leftLength != 0) {
      local_458 = 0;
      do {
        if ((uint)rightLength == local_458) {
          local_458 = (ulong)(uint)rightLength;
          goto LAB_0021f9bd;
        }
        if (left[local_458] != right[local_458]) goto LAB_0021f9bd;
        local_458 = local_458 + 1;
      } while ((uint)leftLength != local_458);
    }
    local_458 = (ulong)(uint)leftLength;
    if (leftLength == rightLength) {
      return UCOL_EQUAL;
    }
LAB_0021f9bd:
    local_478 = left + (uint)leftLength;
    local_470 = right + rightLength;
    local_489 = (byte)this->settings->options >> 1 & 1;
    if ((int)local_458 != 0) goto LAB_0021f9f0;
LAB_0021fa32:
    uVar8 = 0;
  }
  local_468 = &this->settings;
  settings = *local_468;
  if (((-1 < settings->fastLatinOptions) &&
      ((leftLength_00 = leftLength - uVar8, leftLength_00 == 0 || ((ushort)left[(int)uVar8] < 0x180)
       ))) && ((rightLength_00 = rightLength - uVar8, rightLength_00 == 0 ||
               ((ushort)right[(int)uVar8] < 0x180)))) {
    if (leftLength < 0) {
      rightLength_00 = -1;
      leftLength_00 = -1;
    }
    UVar4 = CollationFastLatin::compareUTF16
                      (this->data->fastLatinTable,settings->fastLatinPrimaries,
                       settings->fastLatinOptions,left + (int)uVar8,leftLength_00,right + (int)uVar8
                       ,rightLength_00);
    if (UVar4 != ~UCOL_GREATER) goto LAB_0021fdf2;
    settings = *local_468;
  }
  local_b0 = left + (int)uVar8;
  local_2c8 = right;
  local_b8 = left;
  if ((settings->options & 1) == 0) {
    local_450._16_8_ = this->data;
    local_450._8_8_ = *(undefined8 *)local_450._16_8_;
    local_240._32_8_ = local_210;
    local_240._24_8_ = (ulong)(uint)local_240._28_4_ << 0x20;
    local_240._40_5_ = 0x28;
    local_d0 = 0;
    local_c8 = (SkippedState *)0x0;
    local_c0 = -1;
    local_bc = local_489;
    local_240._0_8_ = &PTR__UTF16CollationIterator_003d4930;
    local_a8 = local_478;
    local_2c0 = right + (int)uVar8;
    local_450._32_8_ = local_420;
    local_450._24_8_ = (ulong)(uint)local_450._28_4_ << 0x20;
    local_450._40_5_ = 0x28;
    local_2e0 = 0;
    local_2d8 = (SkippedState *)0x0;
    local_2d0 = -1;
    local_2cc = local_489;
    local_450._0_8_ = &PTR__UTF16CollationIterator_003d4930;
    local_2b8 = local_470;
    local_240._8_8_ = local_450._8_8_;
    local_240._16_8_ = local_450._16_8_;
    UVar4 = CollationCompare::compareUpToQuaternary
                      ((CollationIterator *)local_240,(CollationIterator *)local_450,settings,
                       errorCode);
    UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)local_450);
    UTF16CollationIterator::~UTF16CollationIterator((UTF16CollationIterator *)local_240);
  }
  else {
    local_450._16_8_ = this->data;
    local_450._8_8_ = *(undefined8 *)local_450._16_8_;
    local_240._32_8_ = local_210;
    local_240._24_8_ = (ulong)(uint)local_240._28_4_ << 0x20;
    local_240._40_5_ = 0x28;
    local_d0 = 0;
    local_c8 = (SkippedState *)0x0;
    local_c0 = -1;
    local_bc = local_489;
    local_a8 = local_478;
    local_240._0_8_ = &PTR__FCDUTF16CollationIterator_003d49c0;
    local_90 = (UChar *)0x0;
    local_88 = local_478;
    local_290 = *(Normalizer2Impl **)(local_450._16_8_ + 0x30);
    local_78 = &PTR__UnicodeString_003e4fd8;
    local_70.fStackFields.fLengthAndFlags = 2;
    local_38 = '\x01';
    local_450._32_8_ = local_420;
    local_450._24_8_ = (ulong)(uint)local_450._28_4_ << 0x20;
    local_450._40_5_ = 0x28;
    local_2e0 = 0;
    local_2d8 = (SkippedState *)0x0;
    local_2d0 = -1;
    local_2cc = local_489;
    local_2c0 = right + (int)uVar8;
    local_2b8 = local_470;
    local_450._0_8_ = &PTR__FCDUTF16CollationIterator_003d49c0;
    local_2a0 = (UChar *)0x0;
    local_298 = local_470;
    local_288 = &PTR__UnicodeString_003e4fd8;
    local_280.fStackFields.fLengthAndFlags = 2;
    local_248 = '\x01';
    local_2b0 = right;
    local_2a8 = local_2c0;
    local_240._8_8_ = local_450._8_8_;
    local_240._16_8_ = local_450._16_8_;
    local_a0 = left;
    local_98 = local_b0;
    local_80 = local_290;
    UVar4 = CollationCompare::compareUpToQuaternary
                      ((CollationIterator *)local_240,(CollationIterator *)local_450,settings,
                       errorCode);
    FCDUTF16CollationIterator::~FCDUTF16CollationIterator((FCDUTF16CollationIterator *)local_450);
    FCDUTF16CollationIterator::~FCDUTF16CollationIterator((FCDUTF16CollationIterator *)local_240);
  }
LAB_0021fdf2:
  if (UVar4 != UCOL_EQUAL) {
    return UVar4;
  }
  if ((*local_468)->options < 0xf000) {
    return UCOL_EQUAL;
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    nfcImpl = this->data->nfcImpl;
    if (((*local_468)->options & 1U) == 0) {
      local_240._24_8_ = 0xffffffff;
      local_240._0_8_ = &PTR__UObject_003d4430;
      local_240._40_8_ = local_478;
      local_450._24_8_ = 0xffffffff;
      local_450._0_8_ = &PTR__UObject_003d4430;
      local_450._40_8_ = local_470;
      local_450._32_8_ = (UnicodeString *)(right + (int)uVar8);
      local_240._32_8_ = (UnicodeString *)(left + (int)uVar8);
      UVar4 = anon_unknown_16::compareNFDIter
                        (nfcImpl,(NFDIterator *)local_240,(NFDIterator *)local_450);
      UObject::~UObject((UObject *)local_450);
    }
    else {
      anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
                ((FCDUTF16NFDIterator *)local_240,nfcImpl,left + (int)uVar8,local_478);
      anon_unknown_16::FCDUTF16NFDIterator::FCDUTF16NFDIterator
                ((FCDUTF16NFDIterator *)local_450,nfcImpl,right + (int)uVar8,local_470);
      UVar4 = anon_unknown_16::compareNFDIter
                        (nfcImpl,(NFDIterator *)local_240,(NFDIterator *)local_450);
      local_450._0_8_ = &PTR__FCDUTF16NFDIterator_003d4490;
      UnicodeString::~UnicodeString(local_420);
      UObject::~UObject((UObject *)local_450);
      local_240._0_8_ = &PTR__FCDUTF16NFDIterator_003d4490;
      UnicodeString::~UnicodeString(local_210);
    }
    UObject::~UObject((UObject *)local_240);
    return UVar4;
  }
  return UCOL_EQUAL;
}

Assistant:

UCollationResult
RuleBasedCollator::doCompare(const UChar *left, int32_t leftLength,
                             const UChar *right, int32_t rightLength,
                             UErrorCode &errorCode) const {
    // U_FAILURE(errorCode) checked by caller.
    if(left == right && leftLength == rightLength) {
        return UCOL_EQUAL;
    }

    // Identical-prefix test.
    const UChar *leftLimit;
    const UChar *rightLimit;
    int32_t equalPrefixLength = 0;
    if(leftLength < 0) {
        leftLimit = NULL;
        rightLimit = NULL;
        UChar c;
        while((c = left[equalPrefixLength]) == right[equalPrefixLength]) {
            if(c == 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }
    } else {
        leftLimit = left + leftLength;
        rightLimit = right + rightLength;
        for(;;) {
            if(equalPrefixLength == leftLength) {
                if(equalPrefixLength == rightLength) { return UCOL_EQUAL; }
                break;
            } else if(equalPrefixLength == rightLength ||
                      left[equalPrefixLength] != right[equalPrefixLength]) {
                break;
            }
            ++equalPrefixLength;
        }
    }

    UBool numeric = settings->isNumeric();
    if(equalPrefixLength > 0) {
        if((equalPrefixLength != leftLength &&
                    data->isUnsafeBackward(left[equalPrefixLength], numeric)) ||
                (equalPrefixLength != rightLength &&
                    data->isUnsafeBackward(right[equalPrefixLength], numeric))) {
            // Identical prefix: Back up to the start of a contraction or reordering sequence.
            while(--equalPrefixLength > 0 &&
                    data->isUnsafeBackward(left[equalPrefixLength], numeric)) {}
        }
        // Notes:
        // - A longer string can compare equal to a prefix of it if only ignorables follow.
        // - With a backward level, a longer string can compare less-than a prefix of it.

        // Pass the actual start of each string into the CollationIterators,
        // plus the equalPrefixLength position,
        // so that prefix matches back into the equal prefix work.
    }

    int32_t result;
    int32_t fastLatinOptions = settings->fastLatinOptions;
    if(fastLatinOptions >= 0 &&
            (equalPrefixLength == leftLength ||
                left[equalPrefixLength] <= CollationFastLatin::LATIN_MAX) &&
            (equalPrefixLength == rightLength ||
                right[equalPrefixLength] <= CollationFastLatin::LATIN_MAX)) {
        if(leftLength >= 0) {
            result = CollationFastLatin::compareUTF16(data->fastLatinTable,
                                                      settings->fastLatinPrimaries,
                                                      fastLatinOptions,
                                                      left + equalPrefixLength,
                                                      leftLength - equalPrefixLength,
                                                      right + equalPrefixLength,
                                                      rightLength - equalPrefixLength);
        } else {
            result = CollationFastLatin::compareUTF16(data->fastLatinTable,
                                                      settings->fastLatinPrimaries,
                                                      fastLatinOptions,
                                                      left + equalPrefixLength, -1,
                                                      right + equalPrefixLength, -1);
        }
    } else {
        result = CollationFastLatin::BAIL_OUT_RESULT;
    }

    if(result == CollationFastLatin::BAIL_OUT_RESULT) {
        if(settings->dontCheckFCD()) {
            UTF16CollationIterator leftIter(data, numeric,
                                            left, left + equalPrefixLength, leftLimit);
            UTF16CollationIterator rightIter(data, numeric,
                                            right, right + equalPrefixLength, rightLimit);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        } else {
            FCDUTF16CollationIterator leftIter(data, numeric,
                                              left, left + equalPrefixLength, leftLimit);
            FCDUTF16CollationIterator rightIter(data, numeric,
                                                right, right + equalPrefixLength, rightLimit);
            result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
        }
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return (UCollationResult)result;
    }

    // Note: If NUL-terminated, we could get the actual limits from the iterators now.
    // That would complicate the iterators a bit, NUL-terminated strings are only a C convenience,
    // and the benefit seems unlikely to be measurable.

    // Compare identical level.
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    left += equalPrefixLength;
    right += equalPrefixLength;
    if(settings->dontCheckFCD()) {
        UTF16NFDIterator leftIter(left, leftLimit);
        UTF16NFDIterator rightIter(right, rightLimit);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUTF16NFDIterator leftIter(nfcImpl, left, leftLimit);
        FCDUTF16NFDIterator rightIter(nfcImpl, right, rightLimit);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}